

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bipartition.cpp
# Opt level: O2

void __thiscall Bipartition::Bipartition(Bipartition *this)

{
  allocator<unsigned_long> local_31;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_30;
  
  this->_vptr_Bipartition = (_func_int **)&PTR_toString_abi_cxx11__00146a00;
  (this->partition).m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->partition).m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->partition).m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->partition).m_num_bits = 0;
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (&local_30,0,0,&local_31);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (&this->partition,&local_30);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset(&local_30);
  return;
}

Assistant:

Bipartition::Bipartition() {
    partition = boost::dynamic_bitset<>(0);
}